

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamEuler::ComputeNF
          (ChElementBeamEuler *this,double U,ChVectorDynamic<> *Qi,double *detJ,ChVectorDynamic<> *F
          ,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ShapeVector N;
  ShapeVector local_78;
  
  ShapeFunctions(this,&local_78,U);
  *detJ = (this->super_ChElementBeam).length * 0.5;
  lVar9 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < lVar9) {
    lVar10 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (0 < lVar10) {
      pdVar11 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar12 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      *pdVar12 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[0] * *pdVar11;
      if ((lVar9 == 1) || (lVar9 < 6)) goto LAB_006780b0;
      if (lVar10 != 1) {
        auVar15._8_8_ = 0;
        auVar15._0_8_ =
             local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[1];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = pdVar11[1];
        auVar23._8_8_ = 0;
        auVar23._0_8_ =
             local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[6] * pdVar11[5];
        auVar1 = vfmadd231sd_fma(auVar23,auVar15,auVar1);
        pdVar12[1] = auVar1._0_8_;
        if (2 < lVar10) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pdVar11[2];
          auVar19._8_8_ = 0;
          auVar19._0_8_ =
               local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
               m_data.array[6] * pdVar11[4];
          auVar1 = vfmsub231sd_fma(auVar19,auVar15,auVar2);
          pdVar12[2] = auVar1._0_8_;
          if ((lVar10 != 3) &&
             (pdVar12[3] = local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                           m_storage.m_data.array[0] * pdVar11[3], 4 < lVar10)) {
            auVar13._8_8_ = 0;
            auVar13._0_8_ =
                 local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[2];
            auVar3._8_8_ = 0;
            auVar3._0_8_ = pdVar11[2];
            auVar20._8_8_ = 0;
            auVar20._0_8_ =
                 local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[8] * pdVar11[4];
            auVar1 = vfnmadd231sd_fma(auVar20,auVar13,auVar3);
            pdVar12[4] = auVar1._0_8_;
            if (lVar10 != 5) {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = pdVar11[1];
              auVar16._8_8_ = 0;
              auVar16._0_8_ =
                   local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage
                   .m_data.array[8] * pdVar11[5];
              auVar1 = vfmadd231sd_fma(auVar16,auVar13,auVar4);
              pdVar12[5] = auVar1._0_8_;
              if (6 < lVar10) {
                pdVar12[6] = local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>
                             .m_storage.m_data.array[3] * *pdVar11;
                if (lVar10 != 7) {
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ =
                       local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                       m_storage.m_data.array[4];
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = pdVar11[1];
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ =
                       local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                       m_storage.m_data.array[7] * pdVar11[5];
                  auVar1 = vfmadd231sd_fma(auVar24,auVar17,auVar5);
                  pdVar12[7] = auVar1._0_8_;
                  if (8 < lVar10) {
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = pdVar11[2];
                    auVar21._8_8_ = 0;
                    auVar21._0_8_ =
                         local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                         m_storage.m_data.array[7] * pdVar11[4];
                    auVar1 = vfmsub231sd_fma(auVar21,auVar17,auVar6);
                    pdVar12[8] = auVar1._0_8_;
                    if ((lVar10 != 9) &&
                       (pdVar12[9] = local_78.
                                     super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                                     m_storage.m_data.array[3] * pdVar11[3], 10 < lVar10)) {
                      auVar14._8_8_ = 0;
                      auVar14._0_8_ =
                           local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                           m_storage.m_data.array[5];
                      auVar7._8_8_ = 0;
                      auVar7._0_8_ = pdVar11[2];
                      auVar22._8_8_ = 0;
                      auVar22._0_8_ =
                           local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                           m_storage.m_data.array[9] * pdVar11[4];
                      auVar1 = vfnmadd231sd_fma(auVar22,auVar14,auVar7);
                      pdVar12[10] = auVar1._0_8_;
                      if (lVar10 != 0xb) {
                        auVar8._8_8_ = 0;
                        auVar8._0_8_ = pdVar11[1];
                        auVar18._8_8_ = 0;
                        auVar18._0_8_ =
                             local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>
                             .m_storage.m_data.array[9] * pdVar11[5];
                        auVar1 = vfmadd231sd_fma(auVar18,auVar14,auVar8);
                        pdVar12[0xb] = auVar1._0_8_;
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_006780b0:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChElementBeamEuler::ComputeNF(const double U,
                                   ChVectorDynamic<>& Qi,
                                   double& detJ,
                                   const ChVectorDynamic<>& F,
                                   ChVectorDynamic<>* state_x,
                                   ChVectorDynamic<>* state_w) {
    ShapeVector N;
    ShapeFunctions(N, U);  // evaluate shape functions (in compressed vector), btw. not dependant on state

    detJ = this->GetRestLength() / 2.0;

    Qi(0) = N(0) * F(0);
    Qi(1) = N(1) * F(1) + N(6) * F(5);
    Qi(2) = N(1) * F(2) - N(6) * F(4);
    Qi(3) = N(0) * F(3);
    Qi(4) = -N(2) * F(2) + N(8) * F(4);
    Qi(5) = N(2) * F(1) + N(8) * F(5);

    Qi(6) = N(3) * F(0);
    Qi(7) = N(4) * F(1) + N(7) * F(5);
    Qi(8) = N(4) * F(2) - N(7) * F(4);
    Qi(9) = N(3) * F(3);
    Qi(10) = -N(5) * F(2) + N(9) * F(4);
    Qi(11) = N(5) * F(1) + N(9) * F(5);
}